

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O1

bool __thiscall ON_BrepFaceArray::Read(ON_BrepFaceArray *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ON_BrepFace *pOVar5;
  byte bVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int count;
  bool bHavePerFaceColors;
  ON_Color per_face_color;
  int minor_version;
  int major_version;
  ON__UINT32 tcode;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK;
  ON__INT32 local_50;
  bool local_49;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_48;
  int local_44;
  int local_40;
  uint local_3c;
  ON__INT64 local_38;
  
  ON_ClassArray<ON_BrepFace>::Empty((ON_ClassArray<ON_BrepFace> *)this);
  local_3c = 0;
  local_38 = 0;
  local_50 = 0;
  local_40 = 0;
  local_44 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk(file,&local_3c,&local_38);
  if (bVar1) {
    bVar6 = bVar1 && local_3c == 0x40008000;
    if (bVar1 && local_3c == 0x40008000) {
      bVar6 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_40,&local_44);
    }
    if ((bool)bVar6 != false) {
      if (local_40 == 1) {
        bVar6 = ON_BinaryArchive::ReadInt(file,&local_50);
        ON_ClassArray<ON_BrepFace>::SetCapacity((ON_ClassArray<ON_BrepFace> *)this,(long)local_50);
        if (((bool)bVar6) && (0 < local_50)) {
          iVar8 = 1;
          do {
            pOVar5 = ON_ClassArray<ON_BrepFace>::AppendNew((ON_ClassArray<ON_BrepFace> *)this);
            iVar2 = (*(pOVar5->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.
                      super_ON_Object._vptr_ON_Object[0xb])(pOVar5,file);
            bVar6 = (byte)iVar2;
            if (bVar6 == 0) break;
            bVar1 = iVar8 < local_50;
            iVar8 = iVar8 + 1;
          } while (bVar1);
        }
        if (0 < local_44) {
          if (bVar6 == 1 && 0 < local_50) {
            lVar9 = 0x54;
            lVar7 = 1;
            do {
              bVar6 = ON_BinaryArchive::ReadUuid
                                (file,(ON_UUID *)
                                      ((((this->super_ON_ObjectArray<ON_BrepFace>).
                                         super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                                      lVar9 + -0x5c));
              if (local_50 <= lVar7) break;
              lVar9 = lVar9 + 0xd8;
              lVar7 = lVar7 + 1;
            } while ((bool)bVar6);
          }
          if ((bVar6 != 0) && (1 < local_44)) {
            local_49 = false;
            bVar6 = ON_BinaryArchive::ReadBool(file,&local_49);
            if (((bool)bVar6) && ((local_49 == true && ((bool)bVar6 && 0 < local_50)))) {
              lVar9 = 1;
              lVar7 = 0;
              do {
                local_48 = ON_Color::UnsetColor.field_0;
                bVar6 = ON_BinaryArchive::ReadColor(file,(ON_Color *)&local_48);
                if ((bool)bVar6) {
                  uVar3 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
                  uVar4 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_48);
                  if (uVar3 != uVar4) {
                    ON_BrepFace::SetPerFaceColor
                              ((ON_BrepFace *)
                               ((((this->super_ON_ObjectArray<ON_BrepFace>).
                                  super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                               lVar7 + -0x5c),(ON_Color)local_48);
                  }
                }
                bVar1 = lVar9 < local_50;
                lVar7 = lVar7 + 0xd8;
                lVar9 = lVar9 + 1;
              } while ((bool)bVar6 && bVar1);
            }
          }
        }
      }
      else {
        bVar6 = 0;
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(file);
    bVar1 = (bool)(bVar1 & bVar6);
  }
  return bVar1;
}

Assistant:

bool ON_BrepFaceArray::Read( ON_BinaryArchive& file )
{
  Empty();
  ON__UINT32 tcode = 0;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
  int count = 0;
  int i;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
  if (rc) {
    if (tcode != TCODE_ANONYMOUS_CHUNK)
      rc = false;
    if (rc) rc = file.Read3dmChunkVersion(&major_version,&minor_version);
    if (rc) {
      if ( major_version==1 ) 
      {
        if (rc) rc = file.ReadInt(&count);
        SetCapacity(count);
        for ( i = 0; i < count && rc ; i++ ) 
        {
          ON_BrepFace& face = AppendNew();
          rc = face.Read(file)?true:false;
        }    

        if ( minor_version >= 1 )
        {
          // chunk version 1.1 and later has face uuids
          for ( i = 0; i < count && rc; i++ )
          {
            rc = file.ReadUuid( m_a[i].m_face_uuid );
          }

          if (rc && minor_version >= 2)
          {
            // chunk version 1.2 and later has per face colors
            bool bHavePerFaceColors = false;
            rc = file.ReadBool(&bHavePerFaceColors);
            if (rc && bHavePerFaceColors)
            {
              for (i = 0; rc && i < count; i++)
              {
                ON_Color per_face_color = ON_Color::UnsetColor;
                rc = file.ReadColor(per_face_color);
                if (rc && ON_Color::UnsetColor != per_face_color)
                  m_a[i].SetPerFaceColor(per_face_color);
              }
            }
          }
        }
      }
      else 
      {
        rc = 0;
      }
    }
    if ( !file.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}